

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

void __thiscall wabt::WastLexer::ReadWhitespace(WastLexer *this)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  
  pbVar2 = (byte *)this->cursor_;
  if (pbVar2 < this->buffer_end_) {
    iVar3 = this->line_;
    do {
      bVar1 = *pbVar2;
      if (bVar1 < 0xd) {
        if (bVar1 == 9) goto LAB_0015fd14;
        if (bVar1 != 10) {
          return;
        }
        this->cursor_ = (char *)(pbVar2 + 1);
        iVar3 = iVar3 + 1;
        this->line_ = iVar3;
        this->line_start_ = (char *)(pbVar2 + 1);
      }
      else {
        if ((bVar1 != 0x20) && (bVar1 != 0xd)) {
          return;
        }
LAB_0015fd14:
        this->cursor_ = (char *)(pbVar2 + 1);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 < this->buffer_end_);
  }
  return;
}

Assistant:

void WastLexer::ReadWhitespace() {
  while (true) {
    switch (PeekChar()) {
      case ' ':
      case '\t':
      case '\r':
        ReadChar();
        break;

      case '\n':
        ReadChar();
        Newline();
        break;

      default:
        return;
    }
  }
}